

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

index_t anon_unknown.dwarf_787a7::thread_safe_random(index_t choices_in)

{
  index_t iVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(int)choices_in;
  plVar2 = (long *)__tls_get_addr(&PTR_001a8d38);
  lVar3 = (*plVar2 * 0x556 + 0x24d69) % 0xae529;
  if ((int)choices_in < 0xae529) {
    *plVar2 = lVar3;
    iVar1 = (index_t)(lVar3 % (long)uVar4);
  }
  else {
    lVar5 = (lVar3 * 0x556 + 0x24d69) % 0xae529;
    *plVar2 = lVar5;
    lVar5 = (uVar4 / 0xae529) * lVar3 + lVar5;
    if (lVar5 < (long)uVar4) {
      choices_in = 0;
    }
    iVar1 = (int)lVar5 - choices_in;
  }
  return iVar1;
}

Assistant:

index_t thread_safe_random(index_t choices_in) {
        signed_index_t choices = signed_index_t(choices_in);
        static thread_local long int randomseed = 1l ;
        if (choices >= 714025l) {
            long int newrandom = (randomseed * 1366l + 150889l) % 714025l;
            randomseed = (newrandom * 1366l + 150889l) % 714025l;
            newrandom = newrandom * (choices / 714025l) + randomseed;
            if (newrandom >= choices) {
                return index_t(newrandom - choices);
            } else {
                return index_t(newrandom);
            }
        } else {
            randomseed = (randomseed * 1366l + 150889l) % 714025l;
            return index_t(randomseed % choices);
        }
    }